

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::finish_multiline_example(vw *all,cb_explore_adf *data,multi_ex *ec_seq)

{
  bool bVar1;
  size_type sVar2;
  iterator this;
  reference ppeVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  vw *in_RSI;
  example *x;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  multi_ex *in_stack_00000060;
  cb_explore_adf *in_stack_00000068;
  vw *in_stack_00000070;
  example *in_stack_ffffffffffffffc8;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_28 [2];
  
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar2 != 0) {
    output_example_seq(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    CB_ADF::global_print_newline(in_RSI);
  }
  local_28[0]._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
  this = std::vector<example_*,_std::allocator<example_*>_>::end
                   ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)this._M_current,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppeVar3 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(local_28);
    in_stack_ffffffffffffffc8 = *ppeVar3;
    v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)this._M_current);
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(local_28);
  }
  VW::clear_seq_and_finish_examples(in_RSI,in_RDX);
  return;
}

Assistant:

void finish_multiline_example(vw& all, cb_explore_adf& data, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
  {
    output_example_seq(all, data, ec_seq);
    CB_ADF::global_print_newline(all);
  }

  for (auto x : ec_seq)
  {
    x->l.cb.costs.clear();
  }

  VW::clear_seq_and_finish_examples(all, ec_seq);
}